

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dspsubrs.c
# Opt level: O0

void DSP_SetMousePos(LispPTR *args)

{
  int x;
  int y;
  LispPTR *args_local;
  
  if (Mouse_Included != 0) {
    x = GetSmalldata(*args);
    y = GetSmalldata(args[1]);
    set_Xmouseposition(x,y);
  }
  return;
}

Assistant:

void DSP_SetMousePos(LispPTR *args)
{

#ifdef XWINDOW
  if (Mouse_Included)
    set_Xmouseposition((int)(GetSmalldata(args[0])), (int)(GetSmalldata(args[1])));
#endif /* XWINDOW */
#ifdef SDL
  int x = (int)(GetSmalldata(args[0]));
  int y = (int)(GetSmalldata(args[1]));
  sdl_setMousePosition(x, y);
#endif /* SDL */
}